

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator.cpp
# Opt level: O1

void print_block(Function *f)

{
  Value *this;
  ostream *poVar1;
  _List_node_base *p_Var2;
  iterator __end3;
  Value *pVVar3;
  string local_58;
  _List_node_base *local_38;
  
  p_Var2 = (f->basic_blocks_).super__List_base<BasicBlock_*,_std::allocator<BasicBlock_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  local_38 = (_List_node_base *)&f->basic_blocks_;
  if (p_Var2 != local_38) {
    do {
      this = (Value *)p_Var2[1]._M_next;
      if (*(char *)&this[2].type_ == '\0') {
        Value::get_name_abi_cxx11_(&local_58,this);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_58._M_dataplus._M_p,
                            local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"has ",4);
        poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," pre block ",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        for (pVVar3 = (Value *)this[1]._vptr_Value; pVVar3 != this + 1;
            pVVar3 = (Value *)pVVar3->_vptr_Value) {
          Value::get_name_abi_cxx11_
                    (&local_58,
                     (Value *)(pVVar3->use_list_).super__List_base<Use,_std::allocator<Use>_>.
                              _M_impl._M_node.super__List_node_base._M_next);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_58._M_dataplus._M_p,
                              local_58._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
          std::ostream::put((char)poVar1);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
        }
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != local_38);
  }
  return;
}

Assistant:

void print_block(Function* f){
    for(auto bb: f->get_basic_blocks()){
        //std::cout << "**********" << std::endl;
        //std::cout << bb->get_name() << " is a " << (bb->is_fake_block() ? "fake block" : "true block") << std::endl;
        if(!bb->is_fake_block()){
            std::cout << bb->get_name() << "has " << bb->get_pre_basic_blocks().size() << " pre block " << std::endl;
            for(auto succ: bb->get_pre_basic_blocks()){
                std::cout<< succ->get_name() << std::endl;
            }
        }
        //std::cout << "**********" << std::endl;
    }
}